

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O3

void threadTestThr3(void *arg)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(char *)((long)arg + lVar1) != '\0') {
      deAssertFail("data->bytes[ndx] == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x3b);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  *(undefined4 *)arg = 0xffffffff;
  *(undefined4 *)((long)arg + 4) = 0xffffffff;
  *(undefined4 *)((long)arg + 8) = 0xffffffff;
  *(undefined4 *)((long)arg + 0xc) = 0xffffffff;
  return;
}

Assistant:

static void threadTestThr3 (void* arg)
{
	ThreadData3* data = (ThreadData3*)arg;
	int ndx;

	for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(data->bytes); ndx++)
		DE_TEST_ASSERT(data->bytes[ndx] == 0);

	for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(data->bytes); ndx++)
		data->bytes[ndx] = 0xff;
}